

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

Var Js::TypedArray<char,_false,_false>::Create
              (ArrayBufferBase *arrayBuffer,uint32 byteOffSet,uint32 mappedLength,
              JavascriptLibrary *javascriptLibrary)

{
  DynamicType *type;
  uint uVar1;
  Recycler *alloc;
  TypedArray<char,_false,_false> *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (!CARRY4(mappedLength,byteOffSet)) {
    uVar1 = (*(arrayBuffer->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])(arrayBuffer);
    if (mappedLength + byteOffSet <= uVar1) {
      type = (javascriptLibrary->int8ArrayType).ptr;
      local_58 = (undefined1  [8])&TypedArray<char,false,false>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_1902e9;
      data.filename._0_4_ = 0x298;
      alloc = Memory::Recycler::TrackAllocInfo
                        (javascriptLibrary->recycler,(TrackAllocData *)local_58);
      this = (TypedArray<char,_false,_false> *)new<Memory::Recycler>(0x40,alloc,0x387914);
      TypedArray(this,arrayBuffer,byteOffSet,mappedLength,type);
      return this;
    }
  }
  JavascriptError::ThrowRangeError
            ((((((arrayBuffer->super_DynamicObject).super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ec24,
             (PCWSTR)0x0);
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::Create(ArrayBufferBase* arrayBuffer, uint32 byteOffSet, uint32 mappedLength, JavascriptLibrary* javascriptLibrary)
    {
        uint32 totalLength, mappedByteLength;

        if (UInt32Math::Mul(mappedLength, sizeof(TypeName), &mappedByteLength) ||
            UInt32Math::Add(byteOffSet, mappedByteLength, &totalLength) ||
            (totalLength > arrayBuffer->GetByteLength()))
        {
            JavascriptError::ThrowRangeError(arrayBuffer->GetScriptContext(), JSERR_InvalidTypedArrayLength);
        }

        DynamicType *type = javascriptLibrary->GetTypedArrayType<TypeName, clamped>(0);
        return RecyclerNew(javascriptLibrary->GetRecycler(), TypedArray, arrayBuffer, byteOffSet, mappedLength, type);
    }